

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O1

void __thiscall QAbstractAnimation::setCurrentTime(QAbstractAnimation *this,int msecs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  parameter_type pVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  lVar4 = *(long *)(this + 8);
  iVar7 = 0;
  if (msecs < 1) {
    msecs = 0;
  }
  iVar5 = (**(code **)(*(long *)this + 0x60))();
  if ((*(long **)(lVar4 + 0x48) != (long *)0x0) && (**(long **)(lVar4 + 0x48) != 0)) {
    QBindingStorage::registerDependency_helper
              ((QBindingStorage *)(lVar4 + 0x40),(QUntypedPropertyData *)(lVar4 + 0x88));
  }
  iVar1 = *(int *)(lVar4 + 0x88);
  iVar8 = -1;
  if (-1 < iVar1) {
    iVar8 = iVar1 * iVar5;
  }
  if (iVar5 < 1) {
    iVar8 = iVar5;
  }
  iVar9 = msecs;
  if (iVar8 < msecs) {
    iVar9 = iVar8;
  }
  if (iVar8 == -1) {
    iVar9 = msecs;
  }
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
              *)(lVar4 + 0x80));
  iVar2 = *(int *)(lVar4 + 0x80);
  *(int *)(lVar4 + 0x80) = iVar9;
  pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                   *)(lVar4 + 0x7c));
  iVar3 = *(int *)(lVar4 + 0x8c);
  if (0 < iVar5) {
    iVar7 = iVar9 / iVar5;
  }
  if (iVar7 == iVar1) {
    iVar7 = 0;
    if (0 < iVar5) {
      iVar7 = iVar5;
    }
    *(int *)(lVar4 + 0x84) = iVar7;
    iVar7 = 1;
    if (1 < iVar1) {
      iVar7 = iVar1;
    }
    iVar7 = iVar7 + -1;
  }
  else if (pVar6 == Forward) {
    if (0 < iVar5) {
      iVar9 = iVar9 % iVar5;
    }
    *(int *)(lVar4 + 0x84) = iVar9;
  }
  else {
    if (0 < iVar5) {
      iVar9 = (iVar9 + -1) % iVar5 + 1;
    }
    *(int *)(lVar4 + 0x84) = iVar9;
    iVar7 = iVar7 - (uint)(iVar9 == iVar5);
  }
  *(int *)(lVar4 + 0x8c) = iVar7;
  (**(code **)(*(long *)this + 0x68))(this,*(undefined4 *)(lVar4 + 0x84));
  iVar7 = *(int *)(lVar4 + 0x8c);
  pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                   *)(lVar4 + 0x7c));
  iVar5 = *(int *)(lVar4 + 0x80);
  if (iVar7 != iVar3) {
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
    ::notify((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
              *)(lVar4 + 0x8c));
  }
  if (iVar2 != iVar5) {
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
    ::notify((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
              *)(lVar4 + 0x80));
  }
  if (((pVar6 != Forward) || (iVar5 != iVar8)) && (pVar6 != Backward || iVar5 != 0)) {
    return;
  }
  stop(this);
  return;
}

Assistant:

void QAbstractAnimation::setCurrentTime(int msecs)
{
    Q_D(QAbstractAnimation);
    msecs = qMax(msecs, 0);

    // Calculate new time and loop.
    const int dura = duration();
    const int totalLoopCount = d->loopCount;
    const int totalDura = dura <= 0 ? dura : ((totalLoopCount < 0) ? -1 : dura * totalLoopCount);
    if (totalDura != -1)
        msecs = qMin(totalDura, msecs);

    d->totalCurrentTime.removeBindingUnlessInWrapper();

    const int oldCurrentTime = d->totalCurrentTime.valueBypassingBindings();
    d->totalCurrentTime.setValueBypassingBindings(msecs);

    QAbstractAnimation::Direction currentDirection = d->direction;

    // Update new values.
    const int oldLoop = d->currentLoop.valueBypassingBindings();
    int newCurrentLoop = (dura <= 0) ? 0 : (msecs / dura);
    if (newCurrentLoop == totalLoopCount) {
        //we're at the end
        d->currentTime = qMax(0, dura);
        newCurrentLoop = qMax(0, totalLoopCount - 1);
    } else {
        if (currentDirection == Forward) {
            d->currentTime = (dura <= 0) ? msecs : (msecs % dura);
        } else {
            d->currentTime = (dura <= 0) ? msecs : ((msecs - 1) % dura) + 1;
            if (d->currentTime == dura)
                newCurrentLoop = newCurrentLoop - 1;
        }
    }
    d->currentLoop.setValueBypassingBindings(newCurrentLoop);

    // this is a virtual function, so it can update the properties as well
    updateCurrentTime(d->currentTime);

    // read the property values again
    newCurrentLoop = d->currentLoop.valueBypassingBindings();
    currentDirection = d->direction;
    const int newTotalCurrentTime = d->totalCurrentTime.valueBypassingBindings();

    if (newCurrentLoop != oldLoop)
        d->currentLoop.notify();

    /* Notify before calling stop: As seen in tst_QSequentialAnimationGroup::clear
     * we might delete the animation when stop is called. Thus after stop no member
     * of the object must be used anymore.
     */
    if (oldCurrentTime != newTotalCurrentTime)
        d->totalCurrentTime.notify();
    // All animations are responsible for stopping the animation when their
    // own end state is reached; in this case the animation is time driven,
    // and has reached the end.
    if ((currentDirection == Forward && newTotalCurrentTime == totalDura)
        || (currentDirection == Backward && newTotalCurrentTime == 0)) {
        stop();
    }
}